

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

Matrix __thiscall Matrix::operator/(Matrix *this,FLOAT *s)

{
  ostream *this_00;
  double *in_RDX;
  long extraout_RDX;
  long lVar1;
  Matrix MVar2;
  int local_2c;
  int local_28;
  int32_t j;
  int32_t i;
  FLOAT *s_local;
  Matrix *this_local;
  Matrix *C;
  
  if (1e-20 <= ABS(*in_RDX)) {
    Matrix(this,*(int32_t *)(s + 1),*(int32_t *)((long)s + 0xc));
    lVar1 = extraout_RDX;
    for (local_28 = 0; local_28 < *(int *)(s + 1); local_28 = local_28 + 1) {
      for (local_2c = 0; local_2c < *(int *)((long)s + 0xc); local_2c = local_2c + 1) {
        lVar1 = (long)local_2c;
        this->val[local_28][local_2c] =
             *(double *)(*(long *)((long)*s + (long)local_28 * 8) + lVar1 * 8) / *in_RDX;
      }
    }
    MVar2.m = (int)lVar1;
    MVar2.n = (int)((ulong)lVar1 >> 0x20);
    MVar2.val = (FLOAT **)this;
    return MVar2;
  }
  this_00 = std::operator<<((ostream *)&std::cerr,"ERROR: Trying to divide by zero!");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  exit(0);
}

Assistant:

Matrix Matrix::operator/ (const FLOAT &s) {
  if (fabs(s)<1e-20) {
    cerr << "ERROR: Trying to divide by zero!" << endl;
    exit(0);
  }
  Matrix C(m,n);
  for (int32_t i=0; i<m; i++)
    for (int32_t j=0; j<n; j++)
      C.val[i][j] = val[i][j]/s;
  return C;
}